

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ReaderMgr::skipQuotedString(ReaderMgr *this,XMLCh quoteCh)

{
  XMLCh XVar1;
  XMLCh nextCh;
  XMLCh quoteCh_local;
  ReaderMgr *this_local;
  
  do {
    XVar1 = getNextChar(this);
    if (XVar1 == L'\0') {
      return;
    }
  } while (XVar1 != quoteCh);
  return;
}

Assistant:

void ReaderMgr::skipQuotedString(const XMLCh quoteCh)
{
    XMLCh nextCh;
    // If we get an end of file char, then return
    while ((nextCh = getNextChar())!=0)
    {
        // If we get the quote char, then break out
        if (nextCh == quoteCh)
            break;
    }
}